

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O2

int prvTidytmbstrcasecmp(ctmbstr s1,ctmbstr s2)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  lVar4 = 0;
  while( true ) {
    cVar1 = s1[lVar4];
    uVar2 = prvTidyToLower((int)cVar1);
    uVar3 = prvTidyToLower((int)s2[lVar4]);
    if (uVar2 != uVar3) {
      return (uint)(s2[lVar4] < s1[lVar4]) * 2 + -1;
    }
    if (cVar1 == '\0') break;
    lVar4 = lVar4 + 1;
  }
  return 0;
}

Assistant:

int TY_(tmbstrcasecmp)( ctmbstr s1, ctmbstr s2 )
{
    uint c;

    while (c = (uint)(*s1), TY_(ToLower)(c) == TY_(ToLower)((uint)(*s2)))
    {
        if (c == '\0')
            return 0;

        ++s1;
        ++s2;
    }

    return (*s1 > *s2 ? 1 : -1);
}